

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O0

uint64_t __thiscall llvm::hashing::detail::hash_state::finalize(hash_state *this,size_t length)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  size_t length_local;
  hash_state *this_local;
  
  uVar1 = hash_16_bytes(this->h3,this->h5);
  uVar2 = shift_mix(this->h1);
  uVar5 = this->h2;
  uVar3 = hash_16_bytes(this->h4,this->h6);
  uVar4 = shift_mix(length);
  uVar5 = hash_16_bytes(uVar1 + uVar2 * -0x4b6d499041670d8d + uVar5,
                        uVar3 + uVar4 * -0x4b6d499041670d8d + this->h0);
  return uVar5;
}

Assistant:

uint64_t finalize(size_t length) {
    return hash_16_bytes(hash_16_bytes(h3, h5) + shift_mix(h1) * k1 + h2,
                         hash_16_bytes(h4, h6) + shift_mix(length) * k1 + h0);
  }